

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::plot_implicit(Plotter *this,size_t funcid)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  pointer pdVar6;
  bool bVar7;
  Plotter *pPVar8;
  int iVar9;
  pointer __first;
  pointer __last;
  pointer __last_00;
  bool bVar10;
  int iVar11;
  uint uVar12;
  size_type __n;
  pointer __result;
  thread *ptVar13;
  pointer pFVar14;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_00;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_01;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_02;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_03;
  anon_class_48_6_f4d7eaea_for__M_head_impl *__args;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_04;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_05;
  anon_class_48_6_f4d7eaea_for__M_head_impl *extraout_RDX_06;
  uint uVar15;
  int csx;
  int iVar16;
  ulong uVar17;
  size_t in_R8;
  uint uVar18;
  Expr *this_00;
  int iVar19;
  size_t i;
  size_type __n_00;
  float in_XMM4_Da;
  reference rVar20;
  reference rVar21;
  anon_class_48_6_f4d7eaea_for__M_head_impl *local_178;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  size_t funcid_local;
  anon_class_48_6_f4d7eaea_for__M_head_impl worker;
  vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
  interest_squares;
  vector<double,_std::allocator<double>_> coarse_line;
  atomic<int> sqr_id;
  vector<bool,_std::allocator<bool>_> coarse_below_interesting;
  color ineq_color;
  
  pFVar14 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this_00 = &pFVar14[funcid].expr;
  funcid_local = funcid;
  bVar10 = Expr::is_null(this_00);
  if ((!bVar10) &&
     ((pFVar14 = pFVar14 + funcid,
      ((pFVar14->expr).ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start)->opcode != 1 || (pFVar14->type != 0x10)))) {
    anon_unknown_1::get_ineq_color(&ineq_color,&pFVar14->line_color);
    std::vector<double,_std::allocator<double>_>::vector
              (&coarse_line,(long)(this->view).swid + 2,(allocator_type *)&worker);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&coarse_below_interesting,(long)(this->view).swid + 2,(allocator_type *)&worker);
    interest_squares.
    super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    interest_squares.
    super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    interest_squares.
    super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178 = extraout_RDX;
    if ((plot_implicit(unsigned_long)::HIGH_PIX_LIMIT == '\0') &&
       (iVar19 = __cxa_guard_acquire(&plot_implicit(unsigned_long)::HIGH_PIX_LIMIT),
       local_178 = extraout_RDX_05, iVar19 != 0)) {
      plot_implicit::HIGH_PIX_LIMIT = 20000;
      if (20000 < (uint)(200000 / (ulong)(anonymous_namespace)::NUM_THREADS)) {
        plot_implicit::HIGH_PIX_LIMIT = 200000 / (ulong)(anonymous_namespace)::NUM_THREADS;
      }
      __cxa_guard_release(&plot_implicit(unsigned_long)::HIGH_PIX_LIMIT);
      local_178 = extraout_RDX_06;
    }
    for (iVar19 = -1; iVar5 = (this->view).shigh, iVar19 < iVar5 + 3; iVar19 = iVar19 + 4) {
      local_178 = (anon_class_48_6_f4d7eaea_for__M_head_impl *)0x4;
      if (iVar5 <= iVar19) {
        iVar19 = iVar5 + -1;
        local_178 = (anon_class_48_6_f4d7eaea_for__M_head_impl *)((long)iVar19 % 4 & 0xffffffff);
        if ((int)((long)iVar19 % 4) == 0) break;
      }
      dVar1 = (this->view).ymax;
      dVar2 = (this->view).ymin;
      iVar9 = (int)local_178;
      bVar10 = false;
      for (iVar16 = -1; iVar11 = (this->view).swid, iVar16 < iVar11 + 3; iVar16 = iVar16 + 4) {
        local_178 = (anon_class_48_6_f4d7eaea_for__M_head_impl *)0x4;
        if (iVar11 <= iVar16) {
          iVar16 = iVar11 + -1;
          local_178 = (anon_class_48_6_f4d7eaea_for__M_head_impl *)((long)iVar16 % 4 & 0xffffffff);
          if ((int)((long)iVar16 % 4) == 0) break;
        }
        dVar3 = (this->view).xmax;
        dVar4 = (this->view).xmin;
        pdVar6 = (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[this->y_var] = ((dVar1 - dVar2) * (double)(iVar5 - iVar19)) / (double)iVar5 + dVar2;
        pdVar6[this->x_var] = ((dVar3 - dVar4) * (double)iVar16) / (double)iVar11 + dVar4;
        pPVar8 = (Plotter *)Expr::operator()(this_00,&this->env);
        iVar11 = (int)local_178;
        local_178 = extraout_RDX_00;
        if ((iVar11 + -1 <= iVar16) && (iVar9 + -1 <= iVar19)) {
          uVar18 = -(uint)((double)pPVar8 != 0.0) & 1;
          if ((double)pPVar8 < 0.0) {
            uVar18 = 0xffffffff;
          }
          __n_00 = (size_type)(iVar16 + 1);
          rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&coarse_below_interesting,__n_00);
          uVar17 = *rVar20._M_p;
          rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&coarse_below_interesting,__n_00);
          *rVar21._M_p = *rVar21._M_p & ~rVar21._M_mask;
          uVar15 = 0xffffffff;
          if (0.0 <= coarse_line.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(iVar16 + 1) - iVar11]) {
            uVar15 = -(uint)(coarse_line.super__Vector_base<double,_std::allocator<double>_>._M_impl
                             .super__Vector_impl_data._M_start[(iVar16 + 1) - iVar11] != 0.0) & 1;
          }
          if ((int)(uVar15 * uVar18) < 1) {
            rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&coarse_below_interesting,__n_00);
            *rVar21._M_p = *rVar21._M_p | rVar21._M_mask;
          }
          uVar12 = -(uint)(coarse_line.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[__n_00] != 0.0) & 1;
          local_178 = (anon_class_48_6_f4d7eaea_for__M_head_impl *)0xffffffffffffffff;
          if (coarse_line.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[__n_00] < 0.0) {
            uVar12 = 0xffffffff;
          }
          bVar7 = (int)(uVar12 * uVar18) < 1;
          if (((rVar20._M_mask & uVar17) != 0) || (((int)(uVar15 * uVar18) < 1 || bVar7) || bVar10))
          {
            worker.sqr_id = (atomic<int> *)CONCAT44(iVar16 - iVar11,iVar16);
            worker.interest_squares =
                 (vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
                  *)CONCAT44(iVar19 - iVar9,iVar19);
            worker.this = pPVar8;
            std::
            vector<std::tuple<int,int,int,int,double>,std::allocator<std::tuple<int,int,int,int,double>>>
            ::emplace_back<std::tuple<int,int,int,int,double>>
                      ((vector<std::tuple<int,int,int,int,double>,std::allocator<std::tuple<int,int,int,int,double>>>
                        *)&interest_squares,(tuple<int,_int,_int,_int,_double> *)&worker);
            local_178 = extraout_RDX_02;
            bVar10 = bVar7;
          }
          else {
            bVar10 = false;
            if ((0.0 <= (double)pPVar8) && (pFVar14->type != 0x10)) {
              anon_unknown_1::buf_add_screen_rectangle
                        (&this->draw_buf,&this->view,(float)(1 - iVar11) + (float)iVar16,
                         (float)(1 - iVar9) + (float)iVar19,(float)iVar11,(float)iVar9,
                         SUB81(&ineq_color,0),(color *)funcid_local,in_XMM4_Da,in_R8);
              local_178 = extraout_RDX_01;
              bVar10 = false;
            }
          }
        }
        coarse_line.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(long)iVar16 + 1] = (double)pPVar8;
      }
    }
    worker.sqr_id = &sqr_id;
    sqr_id.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    worker.interest_squares = &interest_squares;
    worker.funcid = &funcid_local;
    worker.ineq_color = &ineq_color;
    worker.this = this;
    worker.func = pFVar14;
    if ((anonymous_namespace)::NUM_THREADS < 2) {
      std::
      _Head_base<0UL,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/sxyu[P]nivalis/src/plotter/render.cpp:640:19),_false>
      ::anon_class_48_6_f4d7eaea_for__M_head_impl::operator()(&worker);
    }
    else {
      pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar17 = 0;
          __last = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish, uVar17 < (anonymous_namespace)::NUM_THREADS;
          uVar17 = uVar17 + 1) {
        if (pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                          (&pool,1,"vector::_M_realloc_insert");
          __last_00 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          __first = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start;
          __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                               ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&pool,__n
                               );
          std::allocator_traits<std::allocator<std::thread>>::
          construct<std::thread,nivalis::Plotter::plot_implicit(unsigned_long)::__0&>
                    ((allocator_type *)(((long)__last - (long)__first) + (long)__result),
                     (thread *)&worker,__args);
          ptVar13 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                              (__first,__last,__result,(allocator<std::thread> *)&pool);
          ptVar13 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                              (__last,__last_00,ptVar13 + 1,(allocator<std::thread> *)&pool);
          std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                    ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&pool,__first,
                     (long)pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first >> 3);
          pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = __result + __n;
          local_178 = extraout_RDX_04;
          pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = __result;
        }
        else {
          std::allocator_traits<std::allocator<std::thread>>::
          construct<std::thread,nivalis::Plotter::plot_implicit(unsigned_long)::__0&>
                    ((allocator_type *)
                     pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_finish,(thread *)&worker,local_178);
          ptVar13 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
          local_178 = extraout_RDX_03;
        }
        pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar13;
      }
      for (uVar17 = 0;
          uVar17 < (ulong)((long)pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar17 = uVar17 + 1
          ) {
        std::thread::join();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&pool);
    }
    std::
    _Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ::~_Vector_base(&interest_squares.
                     super__Vector_base<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
                   );
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&coarse_below_interesting.super__Bvector_base<std::allocator<bool>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&coarse_line.super__Vector_base<double,_std::allocator<double>_>);
  }
  return;
}

Assistant:

void Plotter::plot_implicit(size_t funcid) {
    auto& func = funcs[funcid];
    // Implicit function
    if (func.expr.is_null() ||
            (func.expr.ast[0].opcode == OpCode::val &&
             func.type == Function::FUNC_TYPE_IMPLICIT)) {
        // Either 0=0 or c=0 for some c, do not draw
        return;
    }

    // Inequality color
    color::color ineq_color = get_ineq_color(func.line_color);

    // Coarse interval
    static const int COARSE_INTERVAL = 4;

    // Function values in above line
    std::vector<double> coarse_line(view.swid + 2);

    // 'Interesting' squares from above line/to left
    // When a square is painted, need to paint neighbor
    // to below (if changes sign left)/
    // right (if changes sign above) as well
    std::vector<bool> coarse_below_interesting(view.swid + 2);
    bool coarse_right_interesting = false;

    // Interesting squares
    using Square = std::tuple<int, int, int, int, double>;
    std::vector<Square> interest_squares;

    // Increase interval per x pixels
    static const size_t HIGH_PIX_LIMIT =
        std::max<size_t>(200000 / NUM_THREADS, 20000);
    // Maximum number of pixels to draw (stops drawing)
    static const size_t MAX_PIXELS = 300000;
    // Epsilon for bisection
    static const double BISECTION_EPS = 1e-4;

    for (int csy = -1; csy < view.shigh + COARSE_INTERVAL - 1; csy += COARSE_INTERVAL) {
        int cyi = COARSE_INTERVAL;
        if (csy >= view.shigh) {
            csy = view.shigh - 1;
            cyi = (view.shigh-1) % COARSE_INTERVAL;
            if (cyi == 0) break;
        }
        const double cy = _SY_TO_Y(csy);
        coarse_right_interesting = false;
        for (int csx = -1; csx < view.swid + COARSE_INTERVAL - 1; csx += COARSE_INTERVAL) {
            int cxi = COARSE_INTERVAL;
            if (csx >= view.swid) {
                csx = view.swid - 1;
                cxi = (view.swid-1) % COARSE_INTERVAL;
                if (cxi == 0) break;
            }
            // Update interval based on point count
            const double coarse_x = _SX_TO_X(csx);
            double precise_x = coarse_x, precise_y = cy;
            const int xy_pos = csy * view.swid + csx;

            env.vars[y_var] = cy;
            env.vars[x_var] = coarse_x;
            double z = func.expr(env);
            if (csx >= cxi-1 && csy >= cyi-1) {
                bool interesting_square = false;
                int sgn_z = (z < 0 ? -1 : z == 0 ? 0 : 1);
                bool interest_from_left = coarse_right_interesting;
                bool interest_from_above = coarse_below_interesting[csx+1];
                coarse_right_interesting = coarse_below_interesting[csx+1] = false;
                double zleft = coarse_line[csx+1 - cxi];
                int sgn_zleft = (zleft < 0 ? -1 : zleft == 0 ? 0 : 1);
                if (sgn_zleft * sgn_z <= 0) {
                    coarse_below_interesting[csx+1] = true;
                    interesting_square = true;
                }
                double zup = coarse_line[csx+1];
                int sgn_zup = (zup < 0 ? -1 : zup == 0 ? 0 : 1);
                if (sgn_zup * sgn_z <= 0) {
                    coarse_right_interesting = true;
                    interesting_square = true;
                }
                if (interesting_square || interest_from_left ||
                        interest_from_above) {
                    interest_squares.push_back(Square(
                                csy - cyi, csy, csx - cxi, csx, z));
                } else if (sgn_z >= 0 &&
                        func.type !=
                        Function::FUNC_TYPE_IMPLICIT) {
                    // Inequality region
                    buf_add_screen_rectangle(draw_buf, view,
                            csx + (float)(- cxi + 1),
                            csy + (float)(- cyi + 1),
                            (float)cxi, (float)cyi,
                            true, ineq_color, 0.0, funcid);
                }
            }
            coarse_line[csx+1] = z;
        }
    }

#ifndef NIVALIS_EMSCRIPTEN
    std::atomic<int> sqr_id(0);
#else
    int sqr_id(0);
#endif
    auto worker = [&]() {
        std::vector<double> line(view.swid + 2);
        std::vector<bool> fine_paint_below(view.swid + 2);
        std::vector<std::array<int, 3> > tdraws, tdraws_ineq;
        std::vector<PointMarker> tpt_markers;
        Environment tenv = env;
        bool fine_paint_right;
        // Number of pixels drawn, used to increase fine interval
        size_t tpix_cnt = 0;
        // Fine interval (variable)
        int fine_interval = 1;
        while (true) {
            int i = sqr_id++;
            if (i >= interest_squares.size()) break;
            auto& sqr = interest_squares[i];

            if (tpix_cnt > MAX_PIXELS) break;
            // Update interval based on point count
            fine_interval = static_cast<int>(tpix_cnt /
                    HIGH_PIX_LIMIT) + 1;
            if (fine_interval >= 3) fine_interval = 4;

            int ylo, yhi, xlo, xhi; double z_at_xy_hi;
            std::tie(ylo, yhi, xlo, xhi, z_at_xy_hi) = sqr;

            std::fill(fine_paint_below.begin() + (xlo + 1),
                    fine_paint_below.begin() + (xhi + 2), false);
            for (int sy = ylo; sy <= yhi; sy += fine_interval) {
                fine_paint_right = false;
                const double y = _SY_TO_Y(sy);
                for (int sx = xlo; sx <= xhi; sx += fine_interval) {

                    const double x = _SX_TO_X(sx);
                    double z;
                    if (sy == yhi && sx == xhi) {
                        z = z_at_xy_hi;
                    } else {
                        tenv.vars[y_var] = y;
                        tenv.vars[x_var] = x;
                        z = func.expr(tenv);
                    }
                    if (sy > ylo && sx > xlo) {
                        int sgn_z = (z < 0 ? -1 : z == 0 ? 0 : 1);
                        bool paint_square = false;
                        bool paint_from_left = fine_paint_right;
                        bool paint_from_above = fine_paint_below[sx+1];
                        fine_paint_right = fine_paint_below[sx+1] = false;
                        double zup = line[sx+1];
                        int sgn_zup = (zup < 0 ? -1 : zup == 0 ? 0 : 1);
                        if (sgn_zup * sgn_z <= 0) {
                            //     // Bisect up
                            //     tenv.vars[x_var] = x;
                            //     double lo = y;
                            //     double hi = (view.shigh - (sy - fine_interval))*1. / view.shigh * ydiff + view.ymin;
                            //     while (hi - lo > BISECTION_EPS) {
                            //         double mi = (lo + hi) / 2;
                            //         tenv.vars[y_var] = mi;
                            //         double zmi = expr(tenv);
                            //         int sgn_zmi = (zmi < 0 ? -1 : 1);
                            //         if (sgn_z == sgn_zmi) lo = mi;
                            //         else hi = mi;
                            //     }
                            //     precise_y = lo;
                            paint_square = fine_paint_right = true;
                        }
                        double zleft = line[sx+1 - fine_interval];
                        int sgn_zleft = (zleft < 0 ? -1 : zleft == 0 ? 0 : 1);
                        if (sgn_zleft * sgn_z <= 0) {
                            // if (!paint_square) {
                            //     // Bisect left
                            //     tenv.vars[y_var] = y;
                            //     double lo = 1.*(sx - fine_interval) / view.swid * xdiff + view.xmin;
                            //     double hi = x;
                            //     while (hi - lo > BISECTION_EPS) {
                            //         double mi = (lo + hi) / 2;
                            //         tenv.vars[x_var] = mi;
                            //         double zmi = expr(tenv);
                            //         int sgn_zmi = (zmi < 0 ? -1 : 1);
                            //         if (sgn_zleft == sgn_zmi) lo = mi;
                            //         else hi = mi;
                            //     }
                            //     precise_x = lo;
                            // }
                            paint_square = fine_paint_below[sx+1] = true;
                        }
                        if (paint_square || paint_from_left || paint_from_above) {
                            // float precise_sy =
                            //     static_cast<float>(
                            //             (view.ymax - y) / ydiff * view.shigh);
                            // float precise_sx = static_cast<float>(
                            //         (x - view.xmin) / xdiff * view.swid);
                            tdraws.push_back({sx, sy, fine_interval});
                            ++tpix_cnt;
                        } else if (sgn_z >= 0 &&
                                func.type !=
                                Function::FUNC_TYPE_IMPLICIT) {
                            // Inequality region
                            tdraws_ineq.push_back({sx, sy, fine_interval});
                        }
                    }
                    line[sx+1] = z;
                }
            }
        }

        {
#ifndef NIVALIS_EMSCRIPTEN
            std::lock_guard<std::mutex> lock(mtx);
#endif
            if ((func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
                // Draw function line (boundary)
                for (auto& p : tdraws) {
                    buf_add_screen_rectangle(draw_buf, view,
                            p[0] + (float)(- p[2] + 1),
                            p[1] + (float)(- p[2] + 1),
                            (float)(p[2]),
                            (float)(p[2]),
                            true, func.line_color, 0.0, funcid);
                }
            }
            for (auto& p : tdraws_ineq) {
                // Draw inequality region
                buf_add_screen_rectangle(draw_buf, view,
                        p[0] + (float)(- p[2] + 1),
                        p[1] + (float)(- p[2] + 1),
                        (float)p[2],
                        (float)p[2],
                        true,
                        ineq_color, 0.0, funcid);
            }

            size_t sz = pt_markers.size();
            pt_markers.resize(sz + tpt_markers.size());
            std::move(tpt_markers.begin(), tpt_markers.end(),
                    pt_markers.begin() + sz);

            // Show detail lost warning
            if (fine_interval > 1) loss_detail = true;
        }
    };

#ifndef NIVALIS_EMSCRIPTEN
    if (NUM_THREADS <= 1) {
        worker();
    } else {
        std::vector<std::thread> pool;
        for (size_t i = 0; i < NUM_THREADS; ++i) {
            pool.emplace_back(worker);
        }
        for (size_t i = 0; i < pool.size(); ++i) pool[i].join();
    }
#else
    worker();
#endif
}